

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O0

int cd_detection_rule_init(parser_info *info,char **attr)

{
  coda_detection_rule *pcVar1;
  char **attr_local;
  parser_info *info_local;
  
  info->node->free_data = coda_detection_rule_delete;
  pcVar1 = coda_detection_rule_new();
  info->node->data = pcVar1;
  if (info->node->data == (void *)0x0) {
    info_local._4_4_ = -1;
  }
  else {
    register_sub_element
              (info->node,element_cd_match_data,cd_match_data_init,cd_detection_rule_add_entry);
    register_sub_element
              (info->node,element_cd_match_expression,cd_match_expression_init,
               cd_detection_rule_add_entry);
    register_sub_element
              (info->node,element_cd_match_filename,cd_match_filename_init,
               cd_detection_rule_add_entry);
    register_sub_element
              (info->node,element_cd_match_size,cd_match_size_init,cd_detection_rule_add_entry);
    info_local._4_4_ = 0;
  }
  return info_local._4_4_;
}

Assistant:

static int cd_detection_rule_init(parser_info *info, const char **attr)
{
    (void)attr;

    info->node->free_data = (free_data_handler)coda_detection_rule_delete;
    info->node->data = coda_detection_rule_new();
    if (info->node->data == NULL)
    {
        return -1;
    }
    register_sub_element(info->node, element_cd_match_data, cd_match_data_init, cd_detection_rule_add_entry);
    register_sub_element(info->node, element_cd_match_expression, cd_match_expression_init,
                         cd_detection_rule_add_entry);
    register_sub_element(info->node, element_cd_match_filename, cd_match_filename_init, cd_detection_rule_add_entry);
    register_sub_element(info->node, element_cd_match_size, cd_match_size_init, cd_detection_rule_add_entry);

    return 0;
}